

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O2

bool __thiscall Clasp::SolveAlgorithm::hasLimit(SolveAlgorithm *this,Model *m)

{
  uint uVar1;
  uint uVar2;
  SumVec *pSVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  
  bVar6 = Enumerator::tentative((Enumerator *)((this->enum_).ptr_ & 0xfffffffffffffffe));
  if ((bVar6) || (bVar7 = 1, m->num < this->enumLimit_)) {
    bVar6 = Enumerator::optimize((Enumerator *)((this->enum_).ptr_ & 0xfffffffffffffffe));
    if ((bVar6) &&
       ((pSVar3 = m->costs, pSVar3 != (SumVec *)0x0 &&
        (uVar1 = (this->optLimit_).ebo_.size, uVar1 != 0)))) {
      uVar2 = (pSVar3->ebo_).size;
      if (uVar2 < uVar1) {
        uVar1 = uVar2;
      }
      uVar9 = 0;
      do {
        uVar8 = uVar9;
        uVar9 = uVar8;
        if (uVar1 == uVar8) goto LAB_0015f827;
        lVar4 = (this->optLimit_).ebo_.buf[uVar8];
        lVar5 = (pSVar3->ebo_).buf[uVar8];
        uVar9 = uVar8 + 1;
      } while (lVar4 == lVar5);
      uVar9 = (ulong)(lVar4 != lVar5 && lVar5 <= lVar4);
LAB_0015f827:
      bVar7 = uVar1 == uVar8 | (byte)uVar9;
    }
    else {
      bVar7 = 0;
    }
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool SolveAlgorithm::hasLimit(const Model& m) const {
	if (!enum_->tentative() && m.num >= enumLimit_) return true;
	if (enum_->optimize() && m.costs && !optLimit_.empty()) {
		for (std::size_t i = 0, end = std::min(optLimit_.size(), m.costs->size()); i != end; ++i) {
			if (optLimit_[i] != (*m.costs)[i]) {
				return (*m.costs)[i] < optLimit_[i];
			}
		}
		return true;
	}
	return false;
}